

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::verify_active_csoaa
               (label *losses,v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *known,size_t t,
               float multiplier)

{
  wclass *pwVar1;
  wclass **ppwVar2;
  pair<COST_SENSITIVE::wclass_&,_bool> *ppVar3;
  ostream *poVar4;
  void *this;
  ulong in_RDX;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *in_RSI;
  v_array<COST_SENSITIVE::wclass> *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  double dVar6;
  __type_conflict _Var7;
  float err;
  wclass *wc_1;
  wclass *__end1_1;
  wclass *__begin1_1;
  v_array<COST_SENSITIVE::wclass> *__range1_1;
  size_t i;
  wclass *wc;
  wclass *__end1;
  wclass *__begin1;
  v_array<COST_SENSITIVE::wclass> *__range1;
  float threshold;
  float local_70;
  wclass *local_58;
  ulong local_48;
  wclass *local_30;
  
  local_70 = (float)in_RDX;
  dVar6 = std::sqrt((double)(ulong)(uint)local_70);
  fVar5 = in_XMM0_Da / SUB84(dVar6,0);
  ppwVar2 = v_array<COST_SENSITIVE::wclass>::begin(in_RDI);
  local_30 = *ppwVar2;
  ppwVar2 = v_array<COST_SENSITIVE::wclass>::end(in_RDI);
  for (; local_30 != *ppwVar2; local_30 = local_30 + 1) {
  }
  local_48 = 0;
  ppwVar2 = v_array<COST_SENSITIVE::wclass>::begin(in_RDI);
  local_58 = *ppwVar2;
  ppwVar2 = v_array<COST_SENSITIVE::wclass>::end(in_RDI);
  pwVar1 = *ppwVar2;
  for (; local_58 != pwVar1; local_58 = local_58 + 1) {
    ppVar3 = v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::operator[](in_RSI,local_48);
    if ((ppVar3->second & 1U) == 0) {
      v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::operator[](in_RSI,local_48);
      _Var7 = std::pow<float,int>(0.0,0x3ce995);
      if (fVar5 < (float)_Var7) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"verify_active_csoaa failed: truth ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58->class_index);
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_58->x);
        poVar4 = std::operator<<(poVar4,", known[");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48);
        poVar4 = std::operator<<(poVar4,"]=");
        ppVar3 = v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::operator[](in_RSI,local_48);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar3->first->partial_prediction);
        poVar4 = std::operator<<(poVar4,", error=");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)_Var7);
        poVar4 = std::operator<<(poVar4," vs threshold ");
        this = (void *)std::ostream::operator<<(poVar4,fVar5);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
    }
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void verify_active_csoaa(
    COST_SENSITIVE::label& losses, v_array<pair<CS::wclass&, bool>>& known, size_t t, float multiplier)
{
  float threshold = multiplier / sqrt((float)t);
  cdbg << "verify_active_csoaa, losses = [";
  for (COST_SENSITIVE::wclass& wc : losses.costs) cdbg << " " << wc.class_index << ":" << wc.x;
  cdbg << " ]" << endl;
  // cdbg_print_array("verify_active_csoaa,  known", known);
  size_t i = 0;
  for (COST_SENSITIVE::wclass& wc : losses.costs)
  {
    if (!known[i].second)
    {
      float err = pow(known[i].first.partial_prediction - wc.x, 2);
      if (err > threshold)
      {
        std::cerr << "verify_active_csoaa failed: truth " << wc.class_index << ":" << wc.x << ", known[" << i
                  << "]=" << known[i].first.partial_prediction << ", error=" << err << " vs threshold " << threshold
                  << endl;
      }
    }
    i++;
  }
}